

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void DumpFunction(Proto *f,TString *psource,DumpState *D)

{
  TValue *pTVar1;
  int iVar2;
  int iVar3;
  ulong in_RAX;
  uint uVar4;
  void *pvVar5;
  size_t sVar6;
  lua_State *plVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  lu_byte x;
  ulong local_38;
  
  if ((D->strip == 0) && (f->source != psource)) {
    local_38 = in_RAX;
    DumpString(f->source,D);
    iVar2 = D->status;
  }
  else {
    local_38 = in_RAX & 0xffffffffffffff00;
    iVar2 = D->status;
    if (iVar2 == 0) {
      iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
      D->status = iVar2;
    }
  }
  local_38 = CONCAT44(local_38._4_4_,f->linedefined);
  if (iVar2 == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
    local_38 = CONCAT44(local_38._4_4_,f->lastlinedefined);
    if (iVar2 == 0) {
      iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
      D->status = iVar2;
      local_38 = CONCAT71(local_38._1_7_,f->numparams);
      if (iVar2 == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        local_38 = CONCAT71(local_38._1_7_,f->is_vararg);
        if (iVar2 == 0) {
          iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
          D->status = iVar2;
          local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
          if (iVar2 == 0) {
            iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
            D->status = iVar2;
            local_38 = CONCAT44(local_38._4_4_,f->sizecode);
            if (iVar2 == 0) {
              iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
              D->status = iVar2;
              if (iVar2 == 0 && (long)f->sizecode != 0) {
                iVar2 = (*D->writer)(D->L,f->code,(long)f->sizecode << 2,D->data);
                D->status = iVar2;
              }
              uVar8 = (ulong)(uint)f->sizek;
              local_38 = CONCAT44(local_38._4_4_,f->sizek);
              if (iVar2 == 0) {
                iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
                D->status = iVar2;
              }
              goto LAB_00114172;
            }
          }
        }
      }
    }
  }
  uVar8 = (ulong)(uint)f->sizek;
LAB_00114172:
  if (0 < (int)uVar8) {
    lVar9 = 0;
    do {
      pTVar1 = f->k;
      uVar4 = *(uint *)((long)&pTVar1->tt_ + lVar9);
      local_38 = CONCAT71(local_38._1_7_,(char)uVar4) & 0xffffffffffffff3f;
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        uVar4 = *(uint *)((long)&pTVar1->tt_ + lVar9);
        bVar10 = iVar2 == 0;
      }
      else {
        bVar10 = false;
      }
      uVar4 = uVar4 & 0x3f;
      if (uVar4 < 4) {
        if (uVar4 == 1) {
          local_38 = CONCAT71(local_38._1_7_,*(undefined1 *)((long)&pTVar1->value_ + lVar9));
          if (bVar10) {
            plVar7 = D->L;
            pvVar5 = D->data;
            sVar6 = 1;
LAB_00114231:
            iVar2 = (*D->writer)(plVar7,&local_38,sVar6,pvVar5);
            D->status = iVar2;
          }
        }
        else if (uVar4 == 3) {
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar9);
          goto LAB_00114207;
        }
      }
      else {
        if (uVar4 != 4) {
          if (uVar4 == 0x13) {
            local_38 = *(ulong *)((long)&pTVar1->value_ + lVar9);
LAB_00114207:
            if (bVar10) {
              plVar7 = D->L;
              pvVar5 = D->data;
              sVar6 = 8;
              goto LAB_00114231;
            }
            goto LAB_0011423a;
          }
          if (uVar4 != 0x14) goto LAB_0011423a;
        }
        DumpString(*(TString **)((long)&pTVar1->value_ + lVar9),D);
      }
LAB_0011423a:
      lVar9 = lVar9 + 0x10;
    } while (uVar8 << 4 != lVar9);
    iVar2 = D->status;
  }
  uVar4 = f->sizeupvalues;
  local_38 = CONCAT44(local_38._4_4_,uVar4);
  if (iVar2 == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar4) {
    lVar9 = 0;
    do {
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->instack)[lVar9]);
      if (iVar2 == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->idx)[lVar9]);
        if (iVar2 == 0) {
          iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
          D->status = iVar2;
        }
      }
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar9);
  }
  uVar4 = f->sizep;
  local_38 = CONCAT44(local_38._4_4_,uVar4);
  if (iVar2 == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      DumpFunction(f->p[uVar8],f->source,D);
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  iVar2 = 0;
  if (D->strip == 0) {
    iVar2 = f->sizelineinfo;
  }
  iVar3 = D->status;
  if (iVar3 == 0) {
    local_38._0_4_ = iVar2;
    iVar3 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar3;
    if (iVar2 != 0 && iVar3 == 0) {
      iVar3 = (*D->writer)(D->L,f->lineinfo,(long)iVar2 << 2,D->data);
      D->status = iVar3;
    }
  }
  uVar4 = 0;
  if (D->strip == 0) {
    uVar4 = f->sizelocvars;
  }
  local_38._0_4_ = uVar4;
  if (iVar3 == 0) {
    iVar3 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar3;
  }
  if (0 < (int)uVar4) {
    lVar9 = 0;
    do {
      DumpString(*(TString **)((long)&f->locvars->varname + lVar9),D);
      local_38._0_4_ = *(uint *)((long)&f->locvars->startpc + lVar9);
      iVar3 = D->status;
      if (iVar3 == 0) {
        iVar3 = (*D->writer)(D->L,&local_38,4,D->data);
        D->status = iVar3;
        local_38._0_4_ = *(uint *)((long)&f->locvars->endpc + lVar9);
        if (iVar3 == 0) {
          iVar3 = (*D->writer)(D->L,&local_38,4,D->data);
          D->status = iVar3;
        }
      }
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar9);
  }
  uVar4 = 0;
  if (D->strip == 0) {
    uVar4 = f->sizeupvalues;
  }
  local_38 = CONCAT44(local_38._4_4_,uVar4);
  if (iVar3 == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar4) {
    lVar9 = 0;
    do {
      DumpString(*(TString **)((long)&f->upvalues->name + lVar9),D);
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar9);
  }
  return;
}

Assistant:

static void DumpFunction (const Proto *f, TString *psource, DumpState *D) {
  if (D->strip || f->source == psource)
    DumpString(NULL, D);  /* no debug info or same source as its parent */
  else
    DumpString(f->source, D);
  DumpInt(f->linedefined, D);
  DumpInt(f->lastlinedefined, D);
  DumpByte(f->numparams, D);
  DumpByte(f->is_vararg, D);
  DumpByte(f->maxstacksize, D);
  DumpCode(f, D);
  DumpConstants(f, D);
  DumpUpvalues(f, D);
  DumpProtos(f, D);
  DumpDebug(f, D);
}